

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O2

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::GtMatcher<int>,int>::
CheckElem<int,iutest::detail::GtMatcher<int>>
          (PairMatcher<iutest::detail::GtMatcher<int>,int> *this,int *actual,GtMatcher<int> *matcher
          )

{
  AssertionResult AStack_38;
  
  GtMatcher<int>::operator()(&AStack_38,matcher,actual);
  std::__cxx11::string::~string((string *)&AStack_38);
  return AStack_38.m_result;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }